

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

size_t mpack_expect_enum(mpack_reader_t *reader,char **strings,size_t count)

{
  char *__s;
  uint32_t uVar1;
  mpack_error_t mVar2;
  int iVar3;
  ulong count_00;
  char *__s1;
  size_t sVar4;
  size_t otherlen;
  char *other;
  size_t i;
  char *key;
  size_t keylen;
  size_t count_local;
  char **strings_local;
  mpack_reader_t *reader_local;
  
  uVar1 = mpack_expect_str(reader);
  count_00 = (ulong)uVar1;
  __s1 = mpack_read_bytes_inplace(reader,count_00);
  mpack_done_str(reader);
  mVar2 = mpack_reader_error(reader);
  if (mVar2 == mpack_ok) {
    for (other = (char *)0x0; other < count; other = other + 1) {
      __s = strings[(long)other];
      sVar4 = strlen(__s);
      if ((count_00 == sVar4) && (iVar3 = memcmp(__s1,__s,count_00), iVar3 == 0)) {
        return (size_t)other;
      }
    }
    mpack_reader_flag_error(reader,mpack_error_type);
  }
  return count;
}

Assistant:

size_t mpack_expect_enum(mpack_reader_t* reader, const char* strings[], size_t count) {

    // read the string in-place
    size_t keylen = mpack_expect_str(reader);
    const char* key = mpack_read_bytes_inplace(reader, keylen);
    mpack_done_str(reader);
    if (mpack_reader_error(reader) != mpack_ok)
        return count;

    // find what key it matches
    for (size_t i = 0; i < count; ++i) {
        const char* other = strings[i];
        size_t otherlen = mpack_strlen(other);
        if (keylen == otherlen && mpack_memcmp(key, other, keylen) == 0)
            return i;
    }

    // no matches
    mpack_reader_flag_error(reader, mpack_error_type);
    return count;
}